

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

bool __thiscall gui::TextBox::handleTextEntered(TextBox *this,uint32_t unicode)

{
  bool bVar1;
  size_t sVar2;
  uint in_ESI;
  Widget *in_RDI;
  TextBox *unaff_retaddr;
  bool eventConsumed;
  float *position;
  String *this_00;
  String *in_stack_ffffffffffffffc0;
  Widget *in_stack_ffffffffffffffc8;
  Signal<gui::Widget_*,_const_sf::String_&> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = Widget::handleTextEntered(in_RDI,in_ESI);
  if (((((uint)in_RDI[1].transformable_.m_transform.m_matrix[9] & 1) == 0) && (0x1f < in_ESI)) &&
     (in_ESI != 0x7f)) {
    if ((*(long *)(in_RDI[1].transformable_.m_transform.m_matrix + 7) == 0) ||
       (sVar2 = sf::String::getSize((String *)0x28efe1),
       sVar2 < *(ulong *)(in_RDI[1].transformable_.m_transform.m_matrix + 7))) {
      position = in_RDI[1].transformable_.m_transform.m_matrix + 0xd;
      this_00 = (String *)in_RDI[1].name_.m_string.field_2._M_allocated_capacity;
      sf::String::String((String *)in_RDI,(Uint32)((ulong)&stack0xffffffffffffffc8 >> 0x20));
      sf::String::insert(this_00,(size_t)position,(String *)0x28f038);
      sf::String::~String((String *)0x28f044);
      updateCaretPosition(unaff_retaddr,
                          CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      Signal<gui::Widget_*,_const_sf::String_&>::emit
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool TextBox::handleTextEntered(uint32_t unicode) {
    bool eventConsumed = baseClass::handleTextEntered(unicode);
    if (!readOnly_ && unicode >= '\u0020' && unicode != '\u007f') {    // Printable character.
        if (maxCharacters_ == 0 || boxString_.getSize() < maxCharacters_) {
            boxString_.insert(caretPosition_, sf::String(unicode));
            updateCaretPosition(caretPosition_ + 1);
            onTextChange.emit(this, boxString_);
        }
        return true;
    }
    return eventConsumed;
}